

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::iterate(BBoxRenderCase *this)

{
  size_type *psVar1;
  TestLog *log;
  pointer pIVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  int iVar6;
  ulong uVar7;
  pointer pIVar8;
  ScopedLogSection section;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  string local_2d0;
  string local_2b0;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  ScopedLogSection local_250;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_300 = *puVar5;
    lStack_2f8 = plVar3[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar5;
    local_310 = (ulong *)*plVar3;
  }
  local_308 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  iVar6 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,iVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar7 = 0xf;
  if (local_310 != &local_300) {
    uVar7 = local_300;
  }
  if (uVar7 < (ulong)(local_200 + local_308)) {
    uVar7 = 0xf;
    if (local_208 != local_1f8) {
      uVar7 = local_1f8[0];
    }
    if (uVar7 < (ulong)(local_200 + local_308)) goto LAB_0163b70a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_0163b70a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_208);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2b0.field_2._M_allocated_capacity = *psVar1;
    local_2b0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar1;
    local_2b0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2b0._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_280 = *puVar5;
    lStack_278 = plVar3[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *puVar5;
    local_290 = (ulong *)*plVar3;
  }
  local_288 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  iVar6 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,iVar6 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar7 = 0xf;
  if (local_290 != &local_280) {
    uVar7 = local_280;
  }
  if (uVar7 < (ulong)(local_220 + local_288)) {
    uVar7 = 0xf;
    if (local_228 != local_218) {
      uVar7 = local_218[0];
    }
    if (uVar7 < (ulong)(local_220 + local_288)) goto LAB_0163b898;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_290);
  }
  else {
LAB_0163b898:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_228);
  }
  local_2f0 = &local_2e0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_2e0 = *plVar3;
    uStack_2d8 = puVar4[3];
  }
  else {
    local_2e0 = *plVar3;
    local_2f0 = (long *)*puVar4;
  }
  local_2e8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_260 = *puVar5;
    lStack_258 = plVar3[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar5;
    local_270 = (ulong *)*plVar3;
  }
  local_268 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pIVar8 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,(int)((ulong)((long)pIVar2 - (long)pIVar8) >> 6));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar7 = 0xf;
  if (local_270 != &local_260) {
    uVar7 = local_260;
  }
  if (uVar7 < (ulong)(local_240 + local_268)) {
    uVar7 = 0xf;
    if (local_248 != local_238) {
      uVar7 = local_238[0];
    }
    if ((ulong)(local_240 + local_268) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_270);
      goto LAB_0163ba49;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_248);
LAB_0163ba49:
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2d0.field_2._M_allocated_capacity = *psVar1;
    local_2d0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar1;
    local_2d0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2d0._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_250,log,&local_2b0,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  pIVar8 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_iteration;
  if ((long)this->m_iteration == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])(this,pIVar8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xd])(this,pIVar8);
  iVar6 = this->m_iteration + 1;
  this->m_iteration = iVar6;
  pIVar8 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  tcu::TestLog::endSection(local_250.m_log);
  return (IterateResult)(iVar6 < (int)((ulong)((long)pIVar2 - (long)pIVar8) >> 6));
}

Assistant:

BBoxRenderCase::IterateResult BBoxRenderCase::iterate (void)
{
	const tcu::ScopedLogSection	section		(m_testCtx.getLog(),
											 std::string() + "Iteration" + de::toString((int)m_iteration),
											 std::string() + "Iteration " + de::toString((int)m_iteration+1) + "/" + de::toString((int)m_iterationConfigs.size()));
	const IterationConfig&		config		= m_iterationConfigs[m_iteration];

	// default
	if (m_iteration == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	renderTestPattern(config);
	verifyRenderResult(config);

	if (++m_iteration < (int)m_iterationConfigs.size())
		return CONTINUE;

	return STOP;
}